

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::SetActiveScriptContext_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  TTDSetActiveJsRTContext UNRECOVERED_JUMPTABLE;
  Var pvVar1;
  void *pvVar2;
  ScriptContext *pSVar3;
  
  if (evt->EventKind != SetActiveScriptContextActionTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  pvVar1 = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
  if (pvVar1 == (Var)0x0) {
    pSVar3 = (ScriptContext *)0x0;
  }
  else {
    if (((ulong)pvVar1 >> 0x30 != 0) || (**(int **)((long)pvVar1 + 8) != 0x50)) {
      TTDAbort_unrecoverable_error("Something is not right here!");
    }
    pSVar3 = *(ScriptContext **)(*(long *)(*(long *)((long)pvVar1 + 8) + 8) + 0x490);
  }
  UNRECOVERED_JUMPTABLE = (executeContext->TTDExternalObjectFunctions).pfSetActiveJsRTContext;
  pvVar2 = ThreadContextTTD::GetRuntimeHandle(executeContext);
  (*UNRECOVERED_JUMPTABLE)(pvVar2,pSVar3);
  return;
}

Assistant:

void SetActiveScriptContext_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::SetActiveScriptContextActionTag>(evt);
            Js::Var gvar = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTDAssert(gvar == nullptr || Js::VarIs<Js::GlobalObject>(gvar), "Something is not right here!");

            Js::GlobalObject* gobj = static_cast<Js::GlobalObject*>(gvar);
            Js::ScriptContext* newCtx = (gobj != nullptr) ? gobj->GetScriptContext() : nullptr;

            executeContext->TTDExternalObjectFunctions.pfSetActiveJsRTContext(executeContext->GetRuntimeHandle(), newCtx);
        }